

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_GetIterator(JSContext *ctx,JSValue obj,BOOL is_async)

{
  ushort uVar1;
  int iVar2;
  JSValueUnion JVar3;
  JSValue *pJVar5;
  ulong uVar6;
  JSRefCountHeader *p_4;
  JSRuntime *rt;
  uint uVar7;
  uint uVar8;
  JSRefCountHeader *p;
  JSValueUnion JVar9;
  JSRefCountHeader *p_2;
  char cVar10;
  JSValue v;
  JSValue JVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSValueUnion JVar4;
  
  if (is_async == 0) {
    v = JS_GetPropertyInternal(ctx,obj,0xc6,obj,0);
    JVar3 = v.u;
  }
  else {
    v = JS_GetPropertyInternal(ctx,obj,0xd1,obj,0);
    JVar3 = v.u;
    if ((int)v.tag - 2U < 2) {
      JVar11 = JS_GetPropertyInternal(ctx,obj,0xc6,obj,0);
      if ((uint)JVar11.tag == 6) {
        return JVar11;
      }
      v = JS_GetIterator2(ctx,obj,JVar11);
      JVar3 = v.u;
      if ((0xfffffff4 < (uint)JVar11.tag) &&
         (iVar2 = *JVar11.u.ptr, *(int *)JVar11.u.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar11);
      }
      uVar7 = (uint)v.tag;
      if (uVar7 == 6) {
        return v;
      }
      JVar11 = JS_GetPropertyInternal(ctx,v,0x6a,v,0);
      JVar9 = JVar11.u;
      uVar8 = (uint)JVar11.tag;
      if (uVar8 == 6) {
LAB_00139948:
        uVar6 = 0;
        JVar13 = (JSValue)(ZEXT816(6) << 0x40);
      }
      else {
        JVar13 = JS_NewObjectProtoClass(ctx,ctx->class_proto[0x30],0x30);
        JVar4 = JVar13.u;
        if ((JVar13.tag & 0xffffffffU) == 6) {
          if ((0xfffffff4 < uVar8) &&
             (iVar2 = *JVar9.ptr, *(int *)JVar9.ptr = iVar2 + -1, iVar2 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar11);
          }
        }
        else {
          pJVar5 = (JSValue *)js_mallocz(ctx,0x20);
          if (pJVar5 == (JSValue *)0x0) {
            if ((0xfffffff4 < (uint)JVar13.tag) &&
               (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar13);
            }
            if ((0xfffffff4 < uVar8) &&
               (iVar2 = *JVar9.ptr, *(int *)JVar9.ptr = iVar2 + -1, iVar2 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar11);
            }
            goto LAB_00139948;
          }
          if (0xfffffff4 < uVar7) {
            *(int *)JVar3.ptr = *JVar3.ptr + 1;
          }
          *pJVar5 = v;
          pJVar5[1] = JVar11;
          if ((uint)JVar13.tag == 0xffffffff) {
            *(JSValue **)((long)JVar4.ptr + 0x30) = pJVar5;
          }
        }
        uVar6 = (ulong)JVar4.ptr & 0xffffffff00000000;
      }
      JVar9.ptr = (void *)((ulong)JVar13.u.ptr & 0xffffffff | uVar6);
      JVar12.tag = JVar13.tag;
      JVar12.u.ptr = JVar9.ptr;
      JVar13.tag = JVar13.tag;
      JVar13.u.ptr = JVar9.ptr;
      if (uVar7 < 0xfffffff5) {
        return JVar13;
      }
      iVar2 = *JVar3.ptr;
      *(int *)JVar3.ptr = iVar2 + -1;
      if (1 < iVar2) {
        return JVar12;
      }
      rt = ctx->rt;
      goto LAB_00139abe;
    }
  }
  JVar9 = v.u;
  JVar11.tag = v.tag;
  JVar11.u.float64 = JVar3.float64;
  uVar7 = (uint)v.tag;
  if (uVar7 == 6) {
    return JVar11;
  }
  if (uVar7 == 0xffffffff) {
    uVar1 = *(ushort *)((long)JVar9.ptr + 6);
    if (uVar1 != 0xd) {
      if (uVar1 == 0x29) {
        cVar10 = *(char *)(*(long *)((long)JVar9.ptr + 0x30) + 0x20);
      }
      else {
        cVar10 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
      }
      if (cVar10 == '\0') goto LAB_001399b0;
    }
    JVar12 = JS_GetIterator2(ctx,obj,v);
    iVar2 = *JVar9.ptr;
    *(int *)JVar9.ptr = iVar2 + -1;
    if (1 < iVar2) {
      return JVar12;
    }
    rt = ctx->rt;
LAB_00139abe:
    __JS_FreeValueRT(rt,v);
    return JVar12;
  }
LAB_001399b0:
  if ((0xfffffff4 < uVar7) && (iVar2 = *JVar9.ptr, *(int *)JVar9.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,v);
  }
  JS_ThrowTypeError(ctx,"value is not iterable");
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue JS_GetIterator(JSContext *ctx, JSValueConst obj, BOOL is_async)
{
    JSValue method, ret, sync_iter;

    if (is_async) {
        method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_asyncIterator);
        if (JS_IsException(method))
            return method;
        if (JS_IsUndefined(method) || JS_IsNull(method)) {
            method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_iterator);
            if (JS_IsException(method))
                return method;
            sync_iter = JS_GetIterator2(ctx, obj, method);
            JS_FreeValue(ctx, method);
            if (JS_IsException(sync_iter))
                return sync_iter;
            ret = JS_CreateAsyncFromSyncIterator(ctx, sync_iter);
            JS_FreeValue(ctx, sync_iter);
            return ret;
        }
    } else {
        method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_iterator);
        if (JS_IsException(method))
            return method;
    }
    if (!JS_IsFunction(ctx, method)) {
        JS_FreeValue(ctx, method);
        return JS_ThrowTypeError(ctx, "value is not iterable");
    }
    ret = JS_GetIterator2(ctx, obj, method);
    JS_FreeValue(ctx, method);
    return ret;
}